

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

void __thiscall cmCTestLaunch::LoadConfig(cmCTestLaunch *this)

{
  bool bVar1;
  string *psVar2;
  allocator<char> local_1259;
  string local_1258;
  undefined1 local_1238 [8];
  string fname;
  undefined1 local_1200 [8];
  cmMakefile mf;
  cmGlobalGenerator gg;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3b9;
  string local_3b8;
  undefined1 local_398 [8];
  cmake cm;
  cmCTestLaunch *this_local;
  
  cm._896_8_ = this;
  cmake::cmake((cmake *)local_398,RoleScript,CTest);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"",&local_3b9);
  cmake::SetHomeDirectory((cmake *)local_398,&local_3b8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"",&local_3f1);
  cmake::SetHomeOutputDirectory((cmake *)local_398,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)&gg.InstallTargetEnabled,(cmake *)local_398);
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&gg.InstallTargetEnabled);
  cmGlobalGenerator::cmGlobalGenerator
            ((cmGlobalGenerator *)&mf.IsSourceFileTryCompile,(cmake *)local_398);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)((long)&fname.field_2 + 8),(cmake *)local_398);
  cmMakefile::cmMakefile
            ((cmMakefile *)local_1200,(cmGlobalGenerator *)&mf.IsSourceFileTryCompile,
             (cmStateSnapshot *)((long)&fname.field_2 + 8));
  std::__cxx11::string::string((string *)local_1238,(string *)&this->LogDir);
  std::__cxx11::string::operator+=((string *)local_1238,"CTestLaunchConfig.cmake");
  bVar1 = cmsys::SystemTools::FileExists((string *)local_1238);
  if ((bVar1) &&
     (bVar1 = cmMakefile::ReadListFile((cmMakefile *)local_1200,(string *)local_1238), bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1258,"CTEST_SOURCE_DIRECTORY",&local_1259);
    psVar2 = cmMakefile::GetSafeDefinition((cmMakefile *)local_1200,&local_1258);
    std::__cxx11::string::operator=((string *)&this->SourceDir,(string *)psVar2);
    std::__cxx11::string::~string((string *)&local_1258);
    std::allocator<char>::~allocator(&local_1259);
    cmsys::SystemTools::ConvertToUnixSlashes(&this->SourceDir);
  }
  std::__cxx11::string::~string((string *)local_1238);
  cmMakefile::~cmMakefile((cmMakefile *)local_1200);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&mf.IsSourceFileTryCompile);
  cmake::~cmake((cmake *)local_398);
  return;
}

Assistant:

void cmCTestLaunch::LoadConfig()
{
  cmake cm(cmake::RoleScript, cmState::CTest);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  std::string fname = this->LogDir;
  fname += "CTestLaunchConfig.cmake";
  if (cmSystemTools::FileExists(fname) && mf.ReadListFile(fname)) {
    this->SourceDir = mf.GetSafeDefinition("CTEST_SOURCE_DIRECTORY");
    cmSystemTools::ConvertToUnixSlashes(this->SourceDir);
  }
}